

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
 __thiscall
duckdb::BindDecimalArithmetic<false>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  bool bVar1;
  byte bVar2;
  undefined8 *puVar3;
  reference pvVar4;
  pointer pEVar5;
  pointer pDVar6;
  reference pvVar7;
  InternalException *this_01;
  byte bVar8;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *other;
  size_type sVar9;
  byte bVar10;
  uint8_t scale;
  uint8_t width;
  LogicalType result_type;
  uint8_t in_stack_ffffffffffffff7d;
  byte in_stack_ffffffffffffff7e;
  byte bVar11;
  byte local_81;
  _Head_base<0UL,_duckdb::DecimalArithmeticBindData_*,_false> local_80;
  undefined1 local_78 [16];
  char local_68 [16];
  ScalarFunction *local_58;
  string local_50;
  
  local_58 = bound_function;
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = &PTR__FunctionData_0243ce58;
  *(undefined1 *)(puVar3 + 1) = 0;
  *(undefined8 **)this = puVar3;
  local_80._M_head_impl = (DecimalArithmeticBindData *)this;
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = 0;
    bVar10 = 0;
    bVar11 = 0;
  }
  else {
    bVar11 = 0;
    sVar9 = 0;
    bVar10 = 0;
    bVar2 = 0;
    do {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar9);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      if ((pEVar5->return_type).id_ != UNKNOWN) {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,sVar9);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        bVar1 = LogicalType::GetDecimalProperties
                          (&pEVar5->return_type,&local_81,&stack0xffffffffffffff7e);
        if (!bVar1) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          local_78._0_8_ = local_68;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_78,"Could not convert type %s to a decimal.","");
          pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](arguments,sVar9);
          pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar4);
          LogicalType::ToString_abi_cxx11_(&local_50,&pEVar5->return_type);
          InternalException::InternalException<std::__cxx11::string>
                    (this_01,(string *)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50)
          ;
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (bVar11 < local_81) {
          bVar11 = local_81;
        }
        if (bVar2 < in_stack_ffffffffffffff7e) {
          bVar2 = in_stack_ffffffffffffff7e;
        }
        if (bVar10 < (byte)(local_81 - in_stack_ffffffffffffff7e)) {
          bVar10 = local_81 - in_stack_ffffffffffffff7e;
        }
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)((long)(arguments->
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(arguments->
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  bVar8 = bVar11;
  if (bVar11 < (byte)(bVar10 + bVar2)) {
    bVar8 = bVar10 + bVar2;
  }
  bVar2 = NumericCastImpl<unsigned_char,_int,_false>::Convert(bVar8 + 1);
  if ((bVar2 < 0x13) || (0x12 < bVar11)) {
    if (bVar2 < 0x27) goto LAB_01050832;
    pDVar6 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
             ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                           *)local_80._M_head_impl);
  }
  else {
    pDVar6 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
             ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                           *)local_80._M_head_impl);
  }
  pDVar6->check_overflow = true;
LAB_01050832:
  LogicalType::DECIMAL(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7d);
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &(local_58->super_BaseScalarFunction).super_SimpleFunction.arguments;
    sVar9 = 0;
    do {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar9);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      LogicalType::GetDecimalProperties(&pEVar5->return_type,&local_81,&stack0xffffffffffffff7e);
      bVar11 = in_stack_ffffffffffffff7e;
      bVar2 = DecimalType::GetScale((LogicalType *)local_78);
      if ((in_stack_ffffffffffffff7e == bVar2) &&
         ((pEVar5->return_type).physical_type_ == local_78[1])) {
        pvVar7 = vector<duckdb::LogicalType,_true>::operator[](this_00,sVar9);
        if (pvVar7 != &pEVar5->return_type) {
          pvVar7->id_ = (pEVar5->return_type).id_;
          pvVar7->physical_type_ = (pEVar5->return_type).physical_type_;
          other = &(pEVar5->return_type).type_info_;
LAB_010508eb:
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar7->type_info_,other);
        }
      }
      else {
        pvVar7 = vector<duckdb::LogicalType,_true>::operator[](this_00,sVar9);
        if (pvVar7 != (reference)local_78) {
          pvVar7->id_ = (LogicalTypeId)local_78[0];
          pvVar7->physical_type_ = local_78[1];
          other = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_78 + 8);
          goto LAB_010508eb;
        }
      }
      sVar9 = sVar9 + 1;
      in_stack_ffffffffffffff7e = bVar11;
    } while (sVar9 < (ulong)((long)(arguments->
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(arguments->
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (&(local_58->super_BaseScalarFunction).return_type != (LogicalType *)local_78) {
    (local_58->super_BaseScalarFunction).return_type.id_ = (LogicalTypeId)local_78[0];
    (local_58->super_BaseScalarFunction).return_type.physical_type_ = local_78[1];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(local_58->super_BaseScalarFunction).return_type.type_info_,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_78 + 8));
  }
  LogicalType::~LogicalType((LogicalType *)local_78);
  return (unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
          )(__uniq_ptr_impl<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
            )local_80._M_head_impl;
}

Assistant:

unique_ptr<DecimalArithmeticBindData> BindDecimalArithmetic(ClientContext &context, ScalarFunction &bound_function,
                                                            vector<unique_ptr<Expression>> &arguments) {
	auto bind_data = make_uniq<DecimalArithmeticBindData>();

	// get the max width and scale of the input arguments
	uint8_t max_width = 0, max_scale = 0, max_width_over_scale = 0;
	for (idx_t i = 0; i < arguments.size(); i++) {
		if (arguments[i]->return_type.id() == LogicalTypeId::UNKNOWN) {
			continue;
		}
		uint8_t width, scale;
		auto can_convert = arguments[i]->return_type.GetDecimalProperties(width, scale);
		if (!can_convert) {
			throw InternalException("Could not convert type %s to a decimal.", arguments[i]->return_type.ToString());
		}
		max_width = MaxValue<uint8_t>(width, max_width);
		max_scale = MaxValue<uint8_t>(scale, max_scale);
		max_width_over_scale = MaxValue<uint8_t>(width - scale, max_width_over_scale);
	}
	D_ASSERT(max_width > 0);
	uint8_t required_width = MaxValue<uint8_t>(max_scale + max_width_over_scale, max_width);
	if (!IS_MODULO) {
		// for addition/subtraction, we add 1 to the width to ensure we don't overflow
		required_width = NumericCast<uint8_t>(required_width + 1);
		if (required_width > Decimal::MAX_WIDTH_INT64 && max_width <= Decimal::MAX_WIDTH_INT64) {
			// we don't automatically promote past the hugeint boundary to avoid the large hugeint performance penalty
			bind_data->check_overflow = true;
			required_width = Decimal::MAX_WIDTH_INT64;
		}
	}
	if (required_width > Decimal::MAX_WIDTH_DECIMAL) {
		// target width does not fit in decimal at all: truncate the scale and perform overflow detection
		bind_data->check_overflow = true;
		required_width = Decimal::MAX_WIDTH_DECIMAL;
	}
	// arithmetic between two decimal arguments: check the types of the input arguments
	LogicalType result_type = LogicalType::DECIMAL(required_width, max_scale);
	// we cast all input types to the specified type
	for (idx_t i = 0; i < arguments.size(); i++) {
		// first check if the cast is necessary
		// if the argument has a matching scale and internal type as the output type, no casting is necessary
		auto &argument_type = arguments[i]->return_type;
		uint8_t width, scale;
		argument_type.GetDecimalProperties(width, scale);
		if (scale == DecimalType::GetScale(result_type) && argument_type.InternalType() == result_type.InternalType()) {
			bound_function.arguments[i] = argument_type;
		} else {
			bound_function.arguments[i] = result_type;
		}
	}
	bound_function.return_type = result_type;
	return bind_data;
}